

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field,bool immutable,
          ClassNameResolver *name_resolver,Options *options)

{
  float fVar1;
  double dVar2;
  size_t sVar3;
  java *this_00;
  bool bVar4;
  Descriptor *descriptor;
  EnumDescriptor *descriptor_00;
  long lVar5;
  undefined7 in_register_00000009;
  AlphaNum *a;
  AlphaNum *a_00;
  char *__s;
  AlphaNum *this_01;
  string_view text;
  string_view format;
  string_view format_00;
  AlphaNum local_d8;
  AlphaNum local_a8;
  AlphaNum local_78;
  string local_48;
  
  switch(*(undefined4 *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4)) {
  case 1:
  case 3:
    absl::lts_20240722::AlphaNum::AlphaNum(&local_d8,*(int *)(this + 0x50));
    absl::lts_20240722::StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20240722 *)&local_d8,a);
    return __return_storage_ptr__;
  case 2:
    absl::lts_20240722::AlphaNum::AlphaNum(&local_d8,*(long *)(this + 0x50));
    local_a8.piece_ = absl::lts_20240722::NullSafeStringView("L");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_d8);
    return __return_storage_ptr__;
  case 4:
    absl::lts_20240722::AlphaNum::AlphaNum(&local_d8,*(long *)(this + 0x50));
    absl::lts_20240722::StrCat_abi_cxx11_((string *)&local_a8,(lts_20240722 *)&local_d8,a_00);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8,
                   "L");
    goto LAB_0022a148;
  case 5:
    dVar2 = *(double *)(this + 0x50);
    if (INFINITY <= dVar2) {
      __s = "Double.POSITIVE_INFINITY";
      goto LAB_0022a203;
    }
    if (dVar2 <= -INFINITY) {
      __s = "Double.NEGATIVE_INFINITY";
      goto LAB_0022a203;
    }
    if (NAN(dVar2)) {
      __s = "Double.NaN";
      goto LAB_0022a203;
    }
    google::protobuf::io::SimpleDtoa_abi_cxx11_(dVar2);
    local_d8.piece_._M_str = (char *)local_78.piece_._M_len;
    local_d8.piece_._M_len = (size_t)local_78.piece_._M_str;
    local_a8.piece_ = absl::lts_20240722::NullSafeStringView("D");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_d8);
    break;
  case 6:
    fVar1 = *(float *)(this + 0x50);
    if (INFINITY <= fVar1) {
      __s = "Float.POSITIVE_INFINITY";
      goto LAB_0022a203;
    }
    if (fVar1 <= -INFINITY) {
      __s = "Float.NEGATIVE_INFINITY";
      goto LAB_0022a203;
    }
    if (NAN(fVar1)) {
      __s = "Float.NaN";
      goto LAB_0022a203;
    }
    google::protobuf::io::SimpleFtoa_abi_cxx11_(fVar1);
    local_d8.piece_._M_str = (char *)local_78.piece_._M_len;
    local_d8.piece_._M_len = (size_t)local_78.piece_._M_str;
    local_a8.piece_ = absl::lts_20240722::NullSafeStringView("F");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_d8);
    break;
  case 7:
    __s = "false";
    if (this[0x50] != (java)0x0) {
      __s = "true";
    }
LAB_0022a203:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_d8);
    return __return_storage_ptr__;
  case 8:
    descriptor_00 = (EnumDescriptor *)google::protobuf::FieldDescriptor::enum_type();
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_48,(ClassNameResolver *)CONCAT71(in_register_00000009,immutable),descriptor_00
               ,SUB81(field,0));
    local_d8.piece_._M_str = local_48._M_dataplus._M_p;
    local_d8.piece_._M_len = local_48._M_string_length;
    local_a8.piece_ = absl::lts_20240722::NullSafeStringView(".");
    lVar5 = google::protobuf::FieldDescriptor::default_value_enum();
    local_78.piece_._M_str = (char *)**(undefined8 **)(lVar5 + 8);
    local_78.piece_._M_len = (*(undefined8 **)(lVar5 + 8))[1];
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_d8,&local_a8);
LAB_0022a2eb:
    this_01 = (AlphaNum *)&local_48;
    goto LAB_0022a2f3;
  case 9:
    if (this[2] == (java)0xc) {
      if (((byte)this[1] & 1) == 0) {
        __s = "com.google.protobuf.ByteString.EMPTY";
        goto LAB_0022a203;
      }
      absl::lts_20240722::CEscape_abi_cxx11_
                (&local_a8,(*(undefined8 **)(this + 0x50))[1],**(undefined8 **)(this + 0x50));
      local_d8.piece_._M_str = (char *)local_a8.piece_._M_len;
      local_d8.piece_._M_len = (size_t)local_a8.piece_._M_str;
      format._M_str = (char *)&local_d8;
      format._M_len = (size_t)"com.google.protobuf.Internal.bytesDefaultValue(\"$0\")";
      absl::lts_20240722::Substitute_abi_cxx11_
                (__return_storage_ptr__,(lts_20240722 *)0x34,format,(Arg *)name_resolver);
    }
    else {
      sVar3 = **(size_t **)(this + 0x50);
      this_00 = (java *)(*(size_t **)(this + 0x50))[1];
      text._M_str = (char *)&switchD_0022a03c::switchdataD_003b6640;
      text._M_len = sVar3;
      bVar4 = AllAscii(this_00,text);
      if (bVar4) {
        local_d8.piece_ = absl::lts_20240722::NullSafeStringView("\"");
        absl::lts_20240722::CEscape_abi_cxx11_
                  (&local_48,(*(undefined8 **)(this + 0x50))[1],**(undefined8 **)(this + 0x50));
        local_a8.piece_._M_str = local_48._M_dataplus._M_p;
        local_a8.piece_._M_len = local_48._M_string_length;
        local_78.piece_ = absl::lts_20240722::NullSafeStringView("\"");
        absl::lts_20240722::StrCat_abi_cxx11_
                  ((AlphaNum *)__return_storage_ptr__,&local_d8,&local_a8);
        goto LAB_0022a2eb;
      }
      absl::lts_20240722::CEscape_abi_cxx11_(&local_a8,this_00,sVar3);
      local_d8.piece_._M_str = (char *)local_a8.piece_._M_len;
      local_d8.piece_._M_len = (size_t)local_a8.piece_._M_str;
      format_00._M_str = (char *)&local_d8;
      format_00._M_len = (size_t)"com.google.protobuf.Internal.stringDefaultValue(\"$0\")";
      absl::lts_20240722::Substitute_abi_cxx11_
                (__return_storage_ptr__,(lts_20240722 *)0x35,format_00,(Arg *)name_resolver);
    }
LAB_0022a148:
    this_01 = &local_a8;
    goto LAB_0022a2f3;
  case 10:
    descriptor = (Descriptor *)google::protobuf::FieldDescriptor::message_type();
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)&local_78,(ClassNameResolver *)CONCAT71(in_register_00000009,immutable),
               descriptor,SUB81(field,0));
    local_d8.piece_._M_str = (char *)local_78.piece_._M_len;
    local_d8.piece_._M_len = (size_t)local_78.piece_._M_str;
    local_a8.piece_ = absl::lts_20240722::NullSafeStringView(".getDefaultInstance()");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_d8);
    break;
  default:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/java/helpers.cc"
               ,0x215);
    absl::lts_20240722::log_internal::LogMessage::operator<<
              ((LogMessage *)&local_d8,(char (*) [16])"Can\'t get here.");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_d8);
  }
  this_01 = &local_78;
LAB_0022a2f3:
  std::__cxx11::string::~string((string *)this_01);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const FieldDescriptor* field, bool immutable,
                         ClassNameResolver* name_resolver, Options options) {
  // Switch on CppType since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return absl::StrCat(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      // Need to print as a signed int since Java has no unsigned.
      return absl::StrCat(static_cast<int32_t>(field->default_value_uint32()));
    case FieldDescriptor::CPPTYPE_INT64:
      return absl::StrCat(field->default_value_int64(), "L");
    case FieldDescriptor::CPPTYPE_UINT64:
      return absl::StrCat(static_cast<int64_t>(field->default_value_uint64())) +
             "L";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "Double.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "Double.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Double.NaN";
      } else {
        return absl::StrCat(io::SimpleDtoa(value), "D");
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "Float.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "Float.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Float.NaN";
      } else {
        return absl::StrCat(io::SimpleFtoa(value), "F");
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_STRING:
      if (GetType(field) == FieldDescriptor::TYPE_BYTES) {
        if (field->has_default_value()) {
          // See comments in Internal.java for gory details.
          return absl::Substitute(
              "com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
              absl::CEscape(field->default_value_string()));
        } else {
          return "com.google.protobuf.ByteString.EMPTY";
        }
      } else {
        if (AllAscii(field->default_value_string())) {
          // All chars are ASCII.  In this case CEscape() works fine.
          return absl::StrCat(
              "\"", absl::CEscape(field->default_value_string()), "\"");
        } else {
          // See comments in Internal.java for gory details.
          return absl::Substitute(
              "com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
              absl::CEscape(field->default_value_string()));
        }
      }

    case FieldDescriptor::CPPTYPE_ENUM:
      return absl::StrCat(
          name_resolver->GetClassName(field->enum_type(), immutable), ".",
          field->default_value_enum()->name());

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return absl::StrCat(
          name_resolver->GetClassName(field->message_type(), immutable),
          ".getDefaultInstance()");

      // No default because we want the compiler to complain if any new
      // types are added.
  }

  ABSL_LOG(FATAL) << "Can't get here.";
  return "";
}